

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

LValue * __thiscall
anon_unknown.dwarf_b1a926::LValueVisitor::visit<slang::ast::MemberAccessExpression>
          (LValueVisitor *this,MemberAccessExpression *expr,EvalContext *context)

{
  bool bVar1;
  Expression *in_RDI;
  EvalContext *in_stack_00000320;
  MemberAccessExpression *in_stack_00000328;
  nullptr_t in_stack_ffffffffffffffc8;
  Expression *this_00;
  
  this_00 = in_RDI;
  bVar1 = slang::ast::Expression::bad(in_RDI);
  if (bVar1) {
    slang::ast::LValue::LValue((LValue *)this_00,in_stack_ffffffffffffffc8);
  }
  else {
    slang::ast::MemberAccessExpression::evalLValueImpl(in_stack_00000328,in_stack_00000320);
  }
  return (LValue *)in_RDI;
}

Assistant:

LValue visit(const T& expr, EvalContext& context) {
        if constexpr (requires { expr.evalLValueImpl(context); }) {
            if (expr.bad())
                return nullptr;

            return expr.evalLValueImpl(context);
        }
        else {
            // Ensure that we get some kind of diagnostic issued here.
            auto result = expr.eval(context);
            SLANG_ASSERT(result.bad());
            return nullptr;
        }
    }